

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void wc_relative_cb(Fl_Light_Button *i,void *v)

{
  Fl_Type *pFVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Widget_Class_Type *t;
  Fl_Type **ppFVar5;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
    iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"widget_class");
    pp_Var2 = (i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget;
    if (iVar4 != 0) {
      (*pp_Var2[6])(i);
      return;
    }
    (*pp_Var2[5])(i);
    Fl_Button::value(&i->super_Fl_Button,
                     (int)*(char *)((long)&current_widget[1].super_Fl_Type.prev + 1));
    return;
  }
  bVar3 = false;
  ppFVar5 = &Fl_Type::first;
  while (pFVar1 = *ppFVar5, pFVar1 != (Fl_Type *)0x0) {
    if (pFVar1->selected != '\0') {
      iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"widget_class");
      if (iVar4 == 0) {
        *(char *)((long)&pFVar1[2].prev + 1) = (i->super_Fl_Button).value_;
        bVar3 = true;
      }
    }
    ppFVar5 = &pFVar1->next;
  }
  if (bVar3) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void wc_relative_cb(Fl_Light_Button *i, void *v) {
  if (v == LOAD) {
    if (!strcmp(current_widget->type_name(), "widget_class")) {
      i->show();
      i->value(((Fl_Widget_Class_Type *)current_widget)->wc_relative);
    } else {
      i->hide();
    }
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && !strcmp(current_widget->type_name(), "widget_class")) {
        Fl_Widget_Class_Type *t = (Fl_Widget_Class_Type *)o;
        t->wc_relative = i->value();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}